

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_andnot_inplace(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  roaring64_bitmap_t *prVar3;
  
  prVar2 = roaring64_bitmap_create();
  prVar3 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar2,100000);
  roaring64_bitmap_add(prVar2,0x186a1);
  roaring64_bitmap_add(prVar2,200000);
  roaring64_bitmap_add(prVar2,300000);
  roaring64_bitmap_add(prVar3,0x186a1);
  roaring64_bitmap_add(prVar3,200000);
  roaring64_bitmap_add(prVar3,400000);
  roaring64_bitmap_andnot_inplace(prVar2,prVar3);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_contains(prVar2,100000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r1, 100000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x565);
  _Var1 = roaring64_bitmap_contains(prVar2,0x186a1);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r1, 100001)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x566);
  _Var1 = roaring64_bitmap_contains(prVar2,200000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r1, 200000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x567);
  _Var1 = roaring64_bitmap_contains(prVar2,300000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r1, 300000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x568);
  _Var1 = roaring64_bitmap_contains(prVar2,400000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r1, 400000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x569);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  prVar2 = roaring64_bitmap_from_range(0,100,1);
  prVar3 = roaring64_bitmap_from_range(0,100,1);
  roaring64_bitmap_andnot_inplace(prVar2,prVar3);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_is_empty(prVar2);
  _assert_true((ulong)_Var1,"roaring64_bitmap_is_empty(r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x575);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  return;
}

Assistant:

DEFINE_TEST(test_andnot_inplace) {
    {
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_t* r2 = roaring64_bitmap_create();

        roaring64_bitmap_add(r1, 100000);
        roaring64_bitmap_add(r1, 100001);
        roaring64_bitmap_add(r1, 200000);
        roaring64_bitmap_add(r1, 300000);

        roaring64_bitmap_add(r2, 100001);
        roaring64_bitmap_add(r2, 200000);
        roaring64_bitmap_add(r2, 400000);

        roaring64_bitmap_andnot_inplace(r1, r2);

        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_contains(r1, 100000));
        assert_false(roaring64_bitmap_contains(r1, 100001));
        assert_false(roaring64_bitmap_contains(r1, 200000));
        assert_true(roaring64_bitmap_contains(r1, 300000));
        assert_false(roaring64_bitmap_contains(r1, 400000));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // Two identical bitmaps.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from_range(0, 100, 1);
        roaring64_bitmap_t* r2 = roaring64_bitmap_from_range(0, 100, 1);

        roaring64_bitmap_andnot_inplace(r1, r2);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_is_empty(r1));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
}